

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.cc
# Opt level: O0

string * el::base::utils::DateTime::timevalToString_abi_cxx11_
                   (timeval tval,char *format,SubsecondPrecision *ssPrec)

{
  size_t in_RCX;
  tm *in_RDI;
  char buff_ [30];
  int kBuffSize;
  tm timeInfo;
  tm *in_stack_ffffffffffffff28;
  SubsecondPrecision *ssPrec_00;
  tm *tInfo;
  char *format_00;
  size_t in_stack_ffffffffffffff58;
  allocator *paVar1;
  char *in_stack_ffffffffffffff60;
  allocator local_89;
  char local_88 [36];
  undefined4 local_64;
  SubsecondPrecision local_60 [8];
  size_t local_20;
  
  ssPrec_00 = local_60;
  tInfo = in_RDI;
  local_20 = in_RCX;
  buildTimeInfo((timeval *)in_RDI,in_stack_ffffffffffffff28);
  local_64 = 0x1e;
  local_88[0x10] = '\0';
  local_88[0x11] = '\0';
  local_88[0x12] = '\0';
  local_88[0x13] = '\0';
  local_88[0x14] = '\0';
  local_88[0x15] = '\0';
  local_88[0x16] = '\0';
  local_88[0x17] = '\0';
  local_88[0x18] = '\0';
  local_88[0x19] = '\0';
  local_88[0x1a] = '\0';
  local_88[0x1b] = '\0';
  local_88[0x1c] = '\0';
  local_88[0x1d] = '\0';
  local_88[0] = '\0';
  local_88[1] = '\0';
  local_88[2] = '\0';
  local_88[3] = '\0';
  local_88[4] = '\0';
  local_88[5] = '\0';
  local_88[6] = '\0';
  local_88[7] = '\0';
  local_88[8] = '\0';
  local_88[9] = '\0';
  local_88[10] = '\0';
  local_88[0xb] = '\0';
  local_88[0xc] = '\0';
  local_88[0xd] = '\0';
  local_88[0xe] = '\0';
  local_88[0xf] = '\0';
  format_00 = local_88;
  parseFormat(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,format_00,tInfo,local_20,ssPrec_00
             );
  paVar1 = &local_89;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)tInfo,format_00,paVar1);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_89);
  return (string *)in_RDI;
}

Assistant:

std::string DateTime::timevalToString(struct timeval tval, const char* format,
                                      const el::base::SubsecondPrecision* ssPrec) {
  struct ::tm timeInfo;
  buildTimeInfo(&tval, &timeInfo);
  const int kBuffSize = 30;
  char buff_[kBuffSize] = "";
  parseFormat(buff_, kBuffSize, format, &timeInfo, static_cast<std::size_t>(tval.tv_usec / ssPrec->m_offset),
              ssPrec);
  return std::string(buff_);
}